

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::updateOkButton(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  QDialogButtonBox *this_01;
  QFileSystemModel *pQVar1;
  bool bVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  char cVar7;
  bool saveAsOnFolder;
  int iVar8;
  undefined4 uVar9;
  char16_t *tmp_1;
  QWidget *this_02;
  bool enable;
  longlong __tmp;
  QWidgetData *pQVar10;
  StandardButton which;
  QFileDialogPrivate *pQVar11;
  long lVar12;
  QArrayData *pQVar13;
  char16_t *pcVar14;
  QTypedArrayData<char16_t> *tmp;
  QArrayData *pQVar15;
  QString *file;
  QString *string;
  long in_FS_OFFSET;
  QLatin1String QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QLatin1String QVar19;
  QStringView QVar20;
  QLatin1String QVar21;
  QStringView QVar22;
  QFileInfo info;
  QWidgetData *local_120;
  undefined1 local_108 [8];
  undefined1 *local_100;
  QString local_f8;
  QString local_d8;
  QArrayData *local_b8;
  char16_t *pcStack_b0;
  QWidgetData *local_a8;
  QString local_98;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = (QDialogButtonBox *)((this->qFileDialogUi).d)->buttonBox;
  iVar8 = QFileDialogOptions::acceptMode();
  which = Save;
  if (iVar8 == 0) {
    which = Open;
  }
  this_02 = (QWidget *)QDialogButtonBox::button(this_01,which);
  if (this_02 == (QWidget *)0x0) goto LAB_004edd20;
  uVar9 = QFileDialogOptions::fileMode();
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialog::selectedFiles((QStringList *)&local_58,this_00);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text(&local_78,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  QVar16.m_data = (char *)0x2;
  QVar16.m_size = (qsizetype)&local_78;
  cVar7 = QString::startsWith(QVar16,0x66fb90);
  if ((cVar7 != '\0') ||
     (cVar7 = QString::startsWith((QChar)(char16_t)&local_78,0x5c), qVar4 = local_58.size,
     cVar7 != '\0')) {
    QWidget::setEnabled(this_02,true);
    saveAsOnFolder = false;
    goto LAB_004edcdc;
  }
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    saveAsOnFolder = false;
    enable = false;
    goto LAB_004edcc6;
  }
  if ((undefined1 *)local_78.d.size == (undefined1 *)0x2) {
    QVar17.m_data = local_78.d.ptr;
    QVar17.m_size = 2;
    QVar21.m_data = "..";
    QVar21.m_size = 2;
    cVar7 = QtPrivate::equalStrings(QVar17,QVar21);
    saveAsOnFolder = true;
    enable = true;
    if (cVar7 != '\0') goto LAB_004edcc6;
  }
  switch(uVar9) {
  case 0:
    local_98.d.d = ((local_58.ptr)->d).d;
    local_98.d.ptr = ((local_58.ptr)->d).ptr;
    local_98.d.size = ((local_58.ptr)->d).size;
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_100 = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_100,(QString *)&local_98);
    local_a8 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemModel::index((QString *)&local_b8,(int)this->model);
    local_d8.d.d = (Data *)0x0;
    local_d8.d.ptr = (char16_t *)0x0;
    local_d8.d.size = 0;
    cVar7 = QFileInfo::isDir();
    if (cVar7 == '\0') {
      QVar18.m_data = local_98.d.ptr;
      QVar18.m_size = local_98.d.size;
      QtPrivate::lastIndexOf(QVar18,-1,L'/',CaseSensitive);
      QString::mid((longlong)&local_f8,(longlong)&local_98);
      pcVar14 = local_d8.d.ptr;
      pDVar5 = local_d8.d.d;
      qVar4 = local_f8.d.size;
      pDVar3 = local_f8.d.d;
      local_f8.d.d = local_d8.d.d;
      local_d8.d.d = pDVar3;
      local_d8.d.ptr = local_f8.d.ptr;
      local_f8.d.ptr = pcVar14;
      local_f8.d.size = local_d8.d.size;
      local_d8.d.size = qVar4;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
        }
      }
      QString::mid((longlong)&local_f8,(longlong)&local_98);
      pQVar10 = (QWidgetData *)local_f8.d.size;
      pcVar14 = local_f8.d.ptr;
      pQVar15 = &(local_f8.d.d)->super_QArrayData;
    }
    else {
      QFileInfo::canonicalFilePath();
      pcVar14 = local_d8.d.ptr;
      pDVar5 = local_d8.d.d;
      qVar4 = local_f8.d.size;
      pDVar3 = local_f8.d.d;
      local_f8.d.d = local_d8.d.d;
      local_d8.d.d = pDVar3;
      local_d8.d.ptr = local_f8.d.ptr;
      local_f8.d.ptr = pcVar14;
      local_f8.d.size = local_d8.d.size;
      local_d8.d.size = qVar4;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
        }
      }
      pQVar10 = (QWidgetData *)0x0;
      pcVar14 = (char16_t *)0x0;
      pQVar15 = (QArrayData *)0x0;
    }
    QVar19.m_data = (char *)0x2;
    QVar19.m_size = (qsizetype)&local_78;
    lVar12 = QString::indexOf(QVar19,0x6773f6,CaseInsensitive);
    pQVar13 = pQVar15;
    local_120 = pQVar10;
    if (lVar12 != -1) {
      QFileInfo::canonicalFilePath();
      pcVar6 = local_d8.d.ptr;
      pDVar5 = local_d8.d.d;
      qVar4 = local_f8.d.size;
      pDVar3 = local_f8.d.d;
      local_f8.d.d = local_d8.d.d;
      local_d8.d.d = pDVar3;
      local_d8.d.ptr = local_f8.d.ptr;
      local_f8.d.ptr = pcVar6;
      local_f8.d.size = local_d8.d.size;
      local_d8.d.size = qVar4;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
        }
      }
      QFileInfo::fileName();
      pQVar13 = &(local_f8.d.d)->super_QArrayData;
      local_120 = (QWidgetData *)local_f8.d.size;
      local_f8.d.d = (Data *)pQVar15;
      local_f8.d.ptr = pcVar14;
      local_f8.d.size = (qsizetype)pQVar10;
      if (pQVar15 != (QArrayData *)0x0) {
        LOCK();
        (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar15,2,0x10);
        }
      }
    }
    QFileDialog::directory((QFileDialog *)local_108);
    QDir::canonicalPath();
    if ((local_d8.d.size == local_f8.d.size) &&
       (QVar20.m_data = local_d8.d.ptr, QVar20.m_size = local_d8.d.size,
       QVar22.m_data = local_f8.d.ptr, QVar22.m_size = local_f8.d.size,
       cVar7 = QtPrivate::equalStrings(QVar20,QVar22), cVar7 != '\0')) {
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDir::~QDir((QDir *)local_108);
      if (local_120 != (QWidgetData *)0x0) goto LAB_004edf8b;
      saveAsOnFolder = false;
      enable = false;
    }
    else {
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDir::~QDir((QDir *)local_108);
LAB_004edf8b:
      if (((-1 < (int)local_b8) && (-1 < (long)local_b8)) && (local_a8 != (QWidgetData *)0x0)) {
        cVar7 = QFileSystemModel::isDir((QModelIndex *)this->model);
        saveAsOnFolder = true;
        enable = true;
        if (cVar7 != '\0') goto LAB_004edff6;
      }
      enable = true;
      if (((((int)local_b8 < 0) || ((long)local_b8 < 0)) || (local_a8 == (QWidgetData *)0x0)) &&
         (lVar12 = maxNameLength(&local_d8), -1 < lVar12)) {
        enable = (long)local_120 <= lVar12;
      }
      saveAsOnFolder = false;
    }
LAB_004edff6:
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_100);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    break;
  case 1:
  case 3:
    lVar12 = qVar4 * 0x18;
    enable = true;
    saveAsOnFolder = false;
    string = local_58.ptr;
    do {
      lVar12 = lVar12 + -0x18;
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar11 = (QFileDialogPrivate *)this->model;
      QFileSystemModel::index((QString *)&local_98,(int)pQVar11);
      if ((((int)local_98.d.d < 0) || ((long)local_98.d.d < 0)) ||
         ((QWidgetData *)local_98.d.size == (QWidgetData *)0x0)) {
        pQVar1 = this->model;
        getEnvironmentVariable(&local_d8,pQVar11,string);
        QFileSystemModel::index((QString *)&local_b8,(int)pQVar1);
        local_98.d.size = (qsizetype)local_a8;
        local_98.d.d = (Data *)local_b8;
        local_98.d.ptr = pcStack_b0;
        if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      bVar2 = true;
      if ((((int)local_98.d.d < 0) || ((long)local_98.d.d < 0)) ||
         ((QWidgetData *)local_98.d.size == (QWidgetData *)0x0)) {
        enable = false;
      }
      else {
        if ((QWidgetData *)local_98.d.size != (QWidgetData *)0x0) {
          cVar7 = QFileSystemModel::isDir((QModelIndex *)this->model);
          bVar2 = true;
          if (cVar7 != '\0') {
            saveAsOnFolder = true;
            goto LAB_004eda18;
          }
        }
        bVar2 = false;
      }
LAB_004eda18:
    } while ((!bVar2) && (string = string + 1, lVar12 != 0));
    break;
  case 2:
    local_98.d.d = ((local_58.ptr)->d).d;
    local_98.d.ptr = ((local_58.ptr)->d).ptr;
    local_98.d.size = ((local_58.ptr)->d).size;
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_98.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a8 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar11 = (QFileDialogPrivate *)this->model;
    QFileSystemModel::index((QString *)&local_b8,(int)pQVar11);
    if ((((int)local_b8 < 0) || ((long)local_b8 < 0)) || (local_a8 == (QWidgetData *)0x0)) {
      pQVar1 = this->model;
      getEnvironmentVariable(&local_f8,pQVar11,&local_98);
      QFileSystemModel::index((QString *)&local_d8,(int)pQVar1);
      local_a8 = (QWidgetData *)local_d8.d.size;
      local_b8 = &(local_d8.d.d)->super_QArrayData;
      pcStack_b0 = local_d8.d.ptr;
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((((int)local_b8 < 0) || ((long)local_b8 < 0)) || (local_a8 == (QWidgetData *)0x0)) {
LAB_004edc87:
      enable = false;
    }
    else {
      cVar7 = QFileSystemModel::isDir((QModelIndex *)this->model);
      enable = true;
      if (cVar7 == '\0') goto LAB_004edc87;
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    goto LAB_004edcbe;
  default:
    enable = true;
LAB_004edcbe:
    saveAsOnFolder = false;
  }
LAB_004edcc6:
  QWidget::setEnabled(this_02,enable);
LAB_004edcdc:
  updateOkButtonText(this,saveAsOnFolder);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
LAB_004edd20:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::updateOkButton()
{
    Q_Q(QFileDialog);
    QPushButton *button =  qFileDialogUi->buttonBox->button((q->acceptMode() == QFileDialog::AcceptOpen)
                    ? QDialogButtonBox::Open : QDialogButtonBox::Save);
    if (!button)
        return;
    const QFileDialog::FileMode fileMode = q->fileMode();

    bool enableButton = true;
    bool isOpenDirectory = false;

    const QStringList files = q->selectedFiles();
    QString lineEditText = lineEdit()->text();

    if (lineEditText.startsWith("//"_L1) || lineEditText.startsWith(u'\\')) {
        button->setEnabled(true);
        updateOkButtonText();
        return;
    }

    if (files.isEmpty()) {
        enableButton = false;
    } else if (lineEditText == ".."_L1) {
        isOpenDirectory = true;
    } else {
        switch (fileMode) {
        case QFileDialog::Directory: {
            QString fn = files.first();
            QModelIndex idx = model->index(fn);
            if (!idx.isValid())
                idx = model->index(getEnvironmentVariable(fn));
            if (!idx.isValid() || !model->isDir(idx))
                enableButton = false;
            break;
        }
        case QFileDialog::AnyFile: {
            QString fn = files.first();
            QFileInfo info(fn);
            QModelIndex idx = model->index(fn);
            QString fileDir;
            QString fileName;
            if (info.isDir()) {
                fileDir = info.canonicalFilePath();
            } else {
                fileDir = fn.mid(0, fn.lastIndexOf(u'/'));
                fileName = fn.mid(fileDir.size() + 1);
            }
            if (lineEditText.contains(".."_L1)) {
                fileDir = info.canonicalFilePath();
                fileName = info.fileName();
            }

            if (fileDir == q->directory().canonicalPath() && fileName.isEmpty()) {
                enableButton = false;
                break;
            }
            if (idx.isValid() && model->isDir(idx)) {
                isOpenDirectory = true;
                enableButton = true;
                break;
            }
            if (!idx.isValid()) {
                const long maxLength = maxNameLength(fileDir);
                enableButton = maxLength < 0 || fileName.size() <= maxLength;
            }
            break;
        }
        case QFileDialog::ExistingFile:
        case QFileDialog::ExistingFiles:
            for (const auto &file : files) {
                QModelIndex idx = model->index(file);
                if (!idx.isValid())
                    idx = model->index(getEnvironmentVariable(file));
                if (!idx.isValid()) {
                    enableButton = false;
                    break;
                }
                if (idx.isValid() && model->isDir(idx)) {
                    isOpenDirectory = true;
                    break;
                }
            }
            break;
        default:
            break;
        }
    }

    button->setEnabled(enableButton);
    updateOkButtonText(isOpenDirectory);
}